

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O2

void Ptex::v2_2::PtexUtils::interleave
               (void *src,int sstride,int uw,int vw,void *dst,int dstride,DataType dt,int nchan)

{
  undefined1 *puVar1;
  void *pvVar2;
  undefined2 *puVar3;
  undefined4 *puVar4;
  undefined1 *puVar5;
  undefined2 *puVar6;
  undefined4 *puVar7;
  unsigned_short *rowend;
  long lVar8;
  uchar *dp;
  undefined1 *puVar9;
  undefined2 *puVar10;
  undefined4 *puVar11;
  
  if (dt - dt_uint16 < 2) {
    puVar3 = (undefined2 *)((long)dst + (long)nchan * 2);
    for (; (undefined2 *)dst != puVar3; dst = (void *)((long)dst + 2)) {
      pvVar2 = (void *)((long)src + (long)(vw * (sstride / 2)) * 2);
      puVar6 = (undefined2 *)dst;
      for (; src != pvVar2; src = (void *)((long)src + (long)(sstride / 2) * 2)) {
        puVar10 = puVar6;
        for (lVar8 = 0; (long)uw * 2 != lVar8; lVar8 = lVar8 + 2) {
          *puVar10 = *(undefined2 *)((long)src + lVar8);
          puVar10 = puVar10 + nchan;
        }
        puVar6 = puVar6 + dstride / 2;
      }
      src = pvVar2;
    }
  }
  else if (dt == dt_float) {
    puVar4 = (undefined4 *)((long)dst + (long)nchan * 4);
    for (; (undefined4 *)dst != puVar4; dst = (void *)((long)dst + 4)) {
      pvVar2 = (void *)((long)src + (long)(vw * (sstride / 4)) * 4);
      puVar7 = (undefined4 *)dst;
      for (; src != pvVar2; src = (void *)((long)src + (long)(sstride / 4) * 4)) {
        puVar11 = puVar7;
        for (lVar8 = 0; (long)uw * 4 != lVar8; lVar8 = lVar8 + 4) {
          *puVar11 = *(undefined4 *)((long)src + lVar8);
          puVar11 = puVar11 + nchan;
        }
        puVar7 = puVar7 + dstride / 4;
      }
      src = pvVar2;
    }
  }
  else if (dt == dt_uint8) {
    puVar1 = (undefined1 *)((long)dst + (long)nchan);
    for (; (undefined1 *)dst != puVar1; dst = (void *)((long)dst + 1)) {
      pvVar2 = (void *)((long)src + (long)(vw * sstride));
      puVar5 = (undefined1 *)dst;
      for (; src != pvVar2; src = (void *)((long)src + (long)sstride)) {
        puVar9 = puVar5;
        for (lVar8 = 0; uw != lVar8; lVar8 = lVar8 + 1) {
          *puVar9 = *(undefined1 *)((long)src + lVar8);
          puVar9 = puVar9 + nchan;
        }
        puVar5 = puVar5 + dstride;
      }
      src = pvVar2;
    }
  }
  return;
}

Assistant:

void interleave(const void* src, int sstride, int uw, int vw,
                void* dst, int dstride, DataType dt, int nchan)
{
    switch (dt) {
    case dt_uint8:     interleave((const uint8_t*) src, sstride, uw, vw,
                                  (uint8_t*) dst, dstride, nchan); break;
    case dt_half:
    case dt_uint16:    interleave((const uint16_t*) src, sstride, uw, vw,
                                  (uint16_t*) dst, dstride, nchan); break;
    case dt_float:     interleave((const float*) src, sstride, uw, vw,
                                  (float*) dst, dstride, nchan); break;
    }
}